

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlnRetime.c
# Opt level: O2

void Wln_RetInsertOneFanin(Wln_Ret_t *p,int iObj,int iFlop)

{
  int iVar1;
  int *piVar2;
  int *piVar3;
  Wln_Ntk_t *p_00;
  long lVar4;
  
  piVar2 = Wln_RetFanins(p,iObj);
  iVar1 = Wln_ObjIsFf(p->pNtk,iFlop);
  if (iVar1 == 0) {
    __assert_fail("Wln_ObjIsFf( p->pNtk, iFlop )",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/wln/wlnRetime.c"
                  ,0x1cd,"void Wln_RetInsertOneFanin(Wln_Ret_t *, int, int)");
  }
  lVar4 = 0;
  do {
    if (p->pNtk->vFanins[iObj].nSize <= lVar4) {
      return;
    }
    piVar3 = Wln_RetFanins(p,iObj);
    iVar1 = piVar3[lVar4 * 2];
    Wln_RetFanins(p,iObj);
    if ((long)iVar1 != 0) {
      p_00 = p->pNtk;
      if (p_00->vFanins[iVar1].nSize == 0) {
        iVar1 = Wln_ObjIsCi(p_00,iVar1);
        if (iVar1 == 0) goto LAB_0030267f;
        p_00 = p->pNtk;
      }
      iVar1 = Wln_ObjIsFf(p_00,iObj);
      if ((lVar4 == 0) || (iVar1 == 0)) {
        iVar1 = piVar2[lVar4 * 2 + 1];
        piVar2[lVar4 * 2 + 1] = (p->vEdgeLinks).nSize;
        Vec_IntPushTwo(&p->vEdgeLinks,iVar1,iFlop);
      }
    }
LAB_0030267f:
    lVar4 = lVar4 + 1;
  } while( true );
}

Assistant:

void Wln_RetInsertOneFanin( Wln_Ret_t * p, int iObj, int iFlop )
{
    int k, iHead, iFanin, * pLink;
    int * pFanins  = Wln_RetFanins( p, iObj );
    assert( Wln_ObjIsFf( p->pNtk, iFlop ) );
    Wln_RetForEachFanin( p, iObj, iFanin, pLink, k )
    {
        if ( Wln_ObjIsFf(p->pNtk, iObj) && k > 0 )
            continue;
        iHead = pFanins[2*k+1];
        pFanins[2*k+1] = Vec_IntSize(&p->vEdgeLinks);
        Vec_IntPushTwo( &p->vEdgeLinks, iHead, iFlop );
    }
}